

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O2

void __thiscall Fl_Graphics_Driver::fixloop(Fl_Graphics_Driver *this)

{
  XPoint *pXVar1;
  uint uVar2;
  
  uVar2 = this->n;
  pXVar1 = this->p;
  while (((2 < (int)uVar2 && (pXVar1[(ulong)uVar2 - 1].x == pXVar1->x)) &&
         (pXVar1[(ulong)uVar2 - 1].y == pXVar1->y))) {
    uVar2 = uVar2 - 1;
    this->n = uVar2;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::fixloop() {  // remove equal points from closed path
  while (n>2 && p[n-1].x == p[0].x && p[n-1].y == p[0].y) n--;
}